

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::ThreadedSocketAcceptor::removeThread(ThreadedSocketAcceptor *this,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  iterator __position;
  
  Mutex::lock(&this->m_mutex);
  p_Var3 = (this->m_threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_threads)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (s <= (int)p_Var3[1]._M_color) {
        __position._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < s];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       ((int)__position._M_node[1]._M_color <= s)) {
      thread_detach((thread_id)__position._M_node[1]._M_parent);
      std::
      _Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,unsigned_long>,std::_Select1st<std::pair<int_const,unsigned_long>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
                          *)&this->m_threads,__position);
    }
  }
  iVar2 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar2 + -1;
  if (1 < iVar2) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ThreadedSocketAcceptor::removeThread(socket_handle s )
{
  Locker l(m_mutex);
  SocketToThread::iterator i = m_threads.find( s );
  if ( i != m_threads.end() )
  {
    thread_detach( i->second );
    m_threads.erase( i );
  }
}